

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_socket_manager::remove_socket(utp_socket_manager *this,uint16_t id)

{
  iterator __position;
  utp_socket_impl *puVar1;
  key_type_conflict2 local_12;
  
  __position = ::std::
               _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
               ::find(&(this->m_utp_sockets)._M_t,&local_12);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header) {
    puVar1 = (utp_socket_impl *)__position._M_node[1]._M_parent;
    if (this->m_last_socket == puVar1) {
      this->m_last_socket = (utp_socket_impl *)0x0;
      puVar1 = (utp_socket_impl *)__position._M_node[1]._M_parent;
    }
    if (this->m_deferred_ack == puVar1) {
      this->m_deferred_ack = (utp_socket_impl *)0x0;
    }
    ::std::
    _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
                        *)&this->m_utp_sockets,__position);
  }
  return;
}

Assistant:

void utp_socket_manager::remove_socket(std::uint16_t const id)
	{
		auto const i = m_utp_sockets.find(id);
		if (i == m_utp_sockets.end()) return;
		if (m_last_socket == i->second.get()) m_last_socket = nullptr;
		if (m_deferred_ack == i->second.get()) m_deferred_ack = nullptr;
		m_utp_sockets.erase(i);
	}